

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkproxy.cpp
# Opt level: O0

void __thiscall
QNetworkProxyQuery::QNetworkProxyQuery
          (QNetworkProxyQuery *this,quint16 bindPort,QString *protocolTag,QueryType queryType)

{
  uint uVar1;
  QNetworkProxyQueryPrivate *pQVar2;
  QueryType in_ECX;
  ushort in_SI;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  
  QSharedDataPointer<QNetworkProxyQueryPrivate>::QSharedDataPointer
            ((QSharedDataPointer<QNetworkProxyQueryPrivate> *)0x24b6cd);
  pQVar2 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyQueryPrivate> *)
                      CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  QUrl::setScheme((QString *)&pQVar2->remote);
  uVar1 = (uint)in_SI;
  pQVar2 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyQueryPrivate> *)
                      (ulong)CONCAT24(in_SI,in_stack_ffffffffffffffd0));
  pQVar2->localPort = uVar1;
  pQVar2 = QSharedDataPointer<QNetworkProxyQueryPrivate>::operator->
                     ((QSharedDataPointer<QNetworkProxyQueryPrivate> *)
                      CONCAT44(uVar1,in_stack_ffffffffffffffd0));
  pQVar2->type = in_ECX;
  return;
}

Assistant:

QNetworkProxyQuery::QNetworkProxyQuery(quint16 bindPort, const QString &protocolTag,
                                       QueryType queryType)
{
    d->remote.setScheme(protocolTag);
    d->localPort = bindPort;
    d->type = queryType;
}